

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O1

void __thiscall QDesktopUnixServices::~QDesktopUnixServices(QDesktopUnixServices *this)

{
  Data *pDVar1;
  Data *pDVar2;
  QObject *pQVar3;
  
  (this->super_QPlatformServices)._vptr_QPlatformServices =
       (_func_int **)&PTR__QDesktopUnixServices_007f3d58;
  pDVar1 = (this->m_watcher).wp.d;
  if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    pQVar3 = (QObject *)0x0;
  }
  else {
    pQVar3 = (this->m_watcher).wp.value;
  }
  if (pQVar3 != (QObject *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  pDVar1 = (this->m_watcher).wp.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pDVar1->weakref)._q_value.super___atomic_base<int>._M_i == 0) &&
       (pDVar1 = (this->m_watcher).wp.d, pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1);
    }
  }
  pDVar2 = (this->m_documentLauncher).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_documentLauncher).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_webBrowser).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_webBrowser).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QDesktopUnixServices::~QDesktopUnixServices()
{
#if QT_CONFIG(dbus)
    delete m_watcher;
#endif
}